

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  
  glfwSetErrorCallback(anon_unknown.dwarf_9a::errorCallback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fwrite("Unable to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22006,1);
    handle = glfwCreateWindow(0x500,0x2d0,"InitGL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle == (GLFWwindow *)0x0) {
      fwrite("Unable to create GLFW window\n",0x1d,1,_stderr);
    }
    else {
      glfwMakeContextCurrent(handle);
      iVar1 = gladLoadGL();
      if (iVar1 == 0) {
        fwrite("Unable to initialize glad\n",0x1a,1,_stderr);
      }
      else {
        (*glad_glClearColor)(0.15,0.6,0.4,1.0);
        while( true ) {
          iVar1 = glfwWindowShouldClose(handle);
          if (iVar1 != 0) break;
          (*glad_glClear)(0x4000);
          glfwSwapBuffers(handle);
          glfwPollEvents();
        }
      }
      glfwDestroyWindow(handle);
    }
    glfwTerminate();
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   glfwSetErrorCallback(errorCallback);

   GLFWwindow* window = initialize();
   if (!window) {
      return 0;
   }

   // Set the clear color to a nice green
   glClearColor(0.15f, 0.6f, 0.4f, 1.0f);

   while (!glfwWindowShouldClose(window)) {
      glClear(GL_COLOR_BUFFER_BIT);

      glfwSwapBuffers(window);
      glfwPollEvents();
   }

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}